

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O3

string * __thiscall
wallet::SQLiteDatabase::Filename_abi_cxx11_(string *__return_storage_ptr__,SQLiteDatabase *this)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->m_file_path)._M_dataplus._M_p;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,pcVar2,pcVar2 + (this->m_file_path)._M_string_length);
}

Assistant:

std::string Filename() override { return m_file_path; }